

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O3

string * toString_abi_cxx11_(char input)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_local_buf[0] = input;
  in_RDI->_M_string_length = 1;
  (in_RDI->field_2)._M_local_buf[1] = '\0';
  return in_RDI;
}

Assistant:

string toString(char input) {
	return string(1, input);
}